

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void jemalloc_prefork(void)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char *in_FS_OFFSET;
  tsd_t *local_38;
  
  local_38 = *(tsd_t **)in_FS_OFFSET;
  if (*in_FS_OFFSET != '\0') {
    local_38 = tsd_fetch_slow(local_38,false);
  }
  uVar2 = (ulong)narenas_total.repr;
  witness_prefork(&local_38->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd);
  ctl_prefork((tsdn_t *)local_38);
  tcache_prefork((tsdn_t *)local_38);
  malloc_mutex_prefork((tsdn_t *)local_38,&arenas_lock);
  background_thread_prefork0((tsdn_t *)local_38);
  prof_prefork0((tsdn_t *)local_38);
  background_thread_prefork1((tsdn_t *)local_38);
  uVar4 = 0;
  do {
    if (uVar2 != 0) {
      uVar1 = 0;
      do {
        if (arenas[uVar1].repr != (void *)0x0) {
          (*(code *)(&DAT_0014ea28 + *(int *)(&DAT_0014ea28 + uVar4 * 4)))();
          return;
        }
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
  } while (uVar3 != 8);
  prof_prefork1((tsdn_t *)local_38);
  tsd_prefork(local_38);
  return;
}

Assistant:

void
jemalloc_prefork(void)
#else
JEMALLOC_EXPORT void
_malloc_prefork(void)
#endif
{
	tsd_t *tsd;
	unsigned i, j, narenas;
	arena_t *arena;

#ifdef JEMALLOC_MUTEX_INIT_CB
	if (!malloc_initialized()) {
		return;
	}
#endif
	assert(malloc_initialized());

	tsd = tsd_fetch();

	narenas = narenas_total_get();

	witness_prefork(tsd_witness_tsdp_get(tsd));
	/* Acquire all mutexes in a safe order. */
	ctl_prefork(tsd_tsdn(tsd));
	tcache_prefork(tsd_tsdn(tsd));
	malloc_mutex_prefork(tsd_tsdn(tsd), &arenas_lock);
	if (have_background_thread) {
		background_thread_prefork0(tsd_tsdn(tsd));
	}
	prof_prefork0(tsd_tsdn(tsd));
	if (have_background_thread) {
		background_thread_prefork1(tsd_tsdn(tsd));
	}
	/* Break arena prefork into stages to preserve lock order. */
	for (i = 0; i < 8; i++) {
		for (j = 0; j < narenas; j++) {
			if ((arena = arena_get(tsd_tsdn(tsd), j, false)) !=
			    NULL) {
				switch (i) {
				case 0:
					arena_prefork0(tsd_tsdn(tsd), arena);
					break;
				case 1:
					arena_prefork1(tsd_tsdn(tsd), arena);
					break;
				case 2:
					arena_prefork2(tsd_tsdn(tsd), arena);
					break;
				case 3:
					arena_prefork3(tsd_tsdn(tsd), arena);
					break;
				case 4:
					arena_prefork4(tsd_tsdn(tsd), arena);
					break;
				case 5:
					arena_prefork5(tsd_tsdn(tsd), arena);
					break;
				case 6:
					arena_prefork6(tsd_tsdn(tsd), arena);
					break;
				case 7:
					arena_prefork7(tsd_tsdn(tsd), arena);
					break;
				default: not_reached();
				}
			}
		}
	}
	prof_prefork1(tsd_tsdn(tsd));
	tsd_prefork(tsd);
}